

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::Matchers::WithinUlpsMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinUlpsMatcher *this)

{
  ostream *poVar1;
  uint64_t uVar2;
  float fVar3;
  double dVar4;
  stringstream ret;
  char local_1a9;
  stringstream local_1a8 [16];
  long local_198;
  undefined8 local_190 [2];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"is within ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ULPs of ",9);
  dVar4 = this->m_target;
  if (this->m_type == Float) {
    *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 8;
    std::ostream::_M_insert<double>((double)(float)dVar4);
    local_1a9 = 'f';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,&local_1a9,1);
  }
  else {
    *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 0x10;
    std::ostream::_M_insert<double>(dVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," ([",3);
  dVar4 = this->m_target;
  if (this->m_type == Double) {
    for (uVar2 = this->m_ulps; uVar2 != 0; uVar2 = uVar2 - 1) {
      dVar4 = ::nextafter(dVar4,-INFINITY);
    }
    *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 0x10;
    std::ostream::_M_insert<double>(dVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,", ",2);
    dVar4 = this->m_target;
    for (uVar2 = this->m_ulps; uVar2 != 0; uVar2 = uVar2 - 1) {
      dVar4 = ::nextafter(dVar4,INFINITY);
    }
    *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 0x10;
  }
  else {
    fVar3 = (float)dVar4;
    for (uVar2 = this->m_ulps; uVar2 != 0; uVar2 = uVar2 - 1) {
      fVar3 = nextafterf(fVar3,-INFINITY);
    }
    *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 8;
    std::ostream::_M_insert<double>((double)fVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,", ",2);
    fVar3 = (float)this->m_target;
    for (uVar2 = this->m_ulps; uVar2 != 0; uVar2 = uVar2 - 1) {
      fVar3 = nextafterf(fVar3,INFINITY);
    }
    *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 8;
    dVar4 = (double)fVar3;
  }
  std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"])",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinUlpsMatcher::describe() const {
        std::stringstream ret;

        ret << "is within " << m_ulps << " ULPs of ";

        if (m_type == Detail::FloatingPointKind::Float) {
            write(ret, static_cast<float>(m_target));
            ret << 'f';
        } else {
            write(ret, m_target);
        }

        ret << " ([";
        if (m_type == Detail::FloatingPointKind::Double) {
            write( ret,
                   step( m_target,
                         -std::numeric_limits<double>::infinity(),
                         m_ulps ) );
            ret << ", ";
            write( ret,
                   step( m_target,
                         std::numeric_limits<double>::infinity(),
                         m_ulps ) );
        } else {
            // We have to cast INFINITY to float because of MinGW, see #1782
            write( ret,
                   step( static_cast<float>( m_target ),
                         -std::numeric_limits<float>::infinity(),
                         m_ulps ) );
            ret << ", ";
            write( ret,
                   step( static_cast<float>( m_target ),
                         std::numeric_limits<float>::infinity(),
                         m_ulps ) );
        }
        ret << "])";

        return ret.str();
    }